

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

TProb Cipher::calcScore(TParameters *params,TFreqMap *freqMap,
                       vector<int,_std::allocator<int>_> *plain,
                       vector<float,_std::allocator<float>_> *memo)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  mapped_type *pmVar7;
  vector<float,_std::allocator<float>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  int *in_RSI;
  long in_RDI;
  double dVar8;
  value_type c_1;
  value_type c;
  TCode mask;
  TCode curc;
  int k;
  int i1;
  float curf;
  int i_1;
  array<float,_28UL> *freq;
  float letFreqCost;
  int i;
  array<int,_28UL> letCount;
  int nlet;
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  *prob;
  TGramLen *len;
  int n;
  TProb res;
  mapped_type in_stack_fffffffffffffed8;
  mapped_type in_stack_fffffffffffffedc;
  mapped_type in_stack_fffffffffffffee0;
  mapped_type in_stack_fffffffffffffee4;
  value_type_conflict1 *in_stack_fffffffffffffee8;
  _Node_iterator_base<std::pair<const_int,_float>,_false> in_stack_fffffffffffffef0;
  _Node_iterator_base<std::pair<const_int,_float>,_false> local_108;
  int local_fc;
  _Node_iterator_base<std::pair<const_int,_float>,_false> local_f8;
  _Node_iterator_base<std::pair<const_int,_float>,_false> local_f0;
  int local_e4;
  uint local_e0;
  uint local_dc;
  int local_d8;
  int local_d4;
  float local_d0;
  int local_cc;
  undefined1 *local_c8;
  float local_c0;
  int local_bc;
  undefined4 local_b8;
  int local_44;
  int *local_40;
  int *local_38;
  int local_30;
  float local_2c;
  vector<float,_std::allocator<float>_> *local_28;
  vector<int,_std::allocator<int>_> *local_20;
  int *local_18;
  long local_10;
  
  local_2c = 0.0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  local_30 = (int)sVar2;
  local_38 = local_18;
  local_40 = local_18 + 6;
  local_44 = 0;
  local_b8 = 0;
  std::array<int,_28UL>::fill
            ((array<int,_28UL> *)in_stack_fffffffffffffef0._M_cur,in_stack_fffffffffffffee8);
  for (local_bc = 0; local_bc < local_30; local_bc = local_bc + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_bc);
    if ((-1 < *pvVar3) &&
       (pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_bc),
       *pvVar3 < 0x1c)) {
      std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_bc);
      pvVar4 = std::array<int,_28UL>::operator[]
                         ((array<int,_28UL> *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar4 = *pvVar4 + 1;
      local_44 = local_44 + 1;
    }
  }
  local_c0 = 0.0;
  local_c8 = (anonymous_namespace)::kEnglishLetterWithSpacesFreq;
  for (local_cc = 0; local_cc < 0x1c; local_cc = local_cc + 1) {
    pvVar5 = std::array<float,_28UL>::operator[]
                       ((array<float,_28UL> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    dVar8 = (double)*pvVar5;
    pvVar4 = std::array<int,_28UL>::operator[]
                       ((array<int,_28UL> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_d0 = (float)(dVar8 * 0.01 + -(double)((float)*pvVar4 / (float)local_44));
    local_c0 = local_d0 * local_d0 + local_c0;
  }
  local_c0 = local_c0 / 28.0;
  dVar8 = sqrt((double)local_c0);
  local_c0 = (float)dVar8;
  local_d4 = 0;
  local_d8 = *local_38;
  local_dc = 0;
  local_e0 = (1 << (((char)*local_38 + -1) * '\x05' & 0x1fU)) - 1;
  while( true ) {
    if (local_d8 < 1) {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         (local_28,(long)(local_d4 + -1));
      if (0.5 < *pvVar6) {
        local_f0._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
             ::find((unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                     *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                    (key_type *)0x15eae4);
        local_f8._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
             ::end((unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                    *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        bVar1 = std::__detail::operator==(&local_f0,&local_f8);
        if (bVar1) {
          in_stack_fffffffffffffee0 = (mapped_type)local_18[4];
        }
        else {
          pmVar7 = std::
                   unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                   ::at((unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                         *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (key_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          in_stack_fffffffffffffee0 = *pmVar7;
        }
        in_stack_fffffffffffffee4 = in_stack_fffffffffffffee0;
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           (local_28,(long)(local_d4 + -1));
        *pvVar6 = in_stack_fffffffffffffee0;
      }
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         (local_28,(long)(local_d4 + -1));
      local_2c = *pvVar6 + local_2c;
      do {
        local_dc = local_e0 & local_dc;
        sVar2 = (size_type)local_d4;
        local_d4 = local_d4 + 1;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_20,sVar2);
        local_fc = *pvVar3;
        local_dc = local_fc + local_dc * 0x20;
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           (local_28,(long)(local_d4 + -1));
        if (0.5 < *pvVar6) {
          local_108._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
               ::find((unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                       *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                      (key_type *)0x15ec24);
          std::
          unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
          ::end((unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          bVar1 = std::__detail::operator==
                            (&local_108,
                             (_Node_iterator_base<std::pair<const_int,_float>,_false> *)
                             &stack0xfffffffffffffef0);
          if (bVar1) {
            in_stack_fffffffffffffed8 = (mapped_type)local_18[4];
          }
          else {
            pmVar7 = std::
                     unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                     ::at((unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                           *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          (key_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
            ;
            in_stack_fffffffffffffed8 = *pmVar7;
          }
          in_stack_fffffffffffffedc = in_stack_fffffffffffffed8;
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                             (local_28,(long)(local_d4 + -1));
          *pvVar6 = in_stack_fffffffffffffed8;
        }
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           (local_28,(long)(local_d4 + -1));
        local_2c = *pvVar6 + local_2c;
      } while (local_d4 < local_30);
      return -*(float *)(local_10 + 0x20) * local_c0 + local_2c / (float)local_30;
    }
    if (local_30 <= local_d4) break;
    sVar2 = (size_type)local_d4;
    local_d4 = local_d4 + 1;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_20,sVar2);
    local_e4 = *pvVar3;
    local_dc = local_e4 + local_dc * 0x20;
    local_d8 = local_d8 + -1;
  }
  return -INFINITY;
}

Assistant:

TProb calcScore(
            const TParameters & params,
            const TFreqMap & freqMap,
            const std::vector<TLetter> & plain,
                  std::vector<TProb> & memo) {
        TProb res = 0.0;

        const int n = plain.size();
        const auto & len  = freqMap.len;
        const auto & prob = freqMap.prob;

        int nlet = 0;
        std::array<int, 28> letCount;
        letCount.fill(0);
        for (int i = 0; i < n; ++i) {
            if (plain[i] >= 0 && plain[i] <= 27) {
                ++letCount[plain[i]];
                ++nlet;
            }
        }

        float letFreqCost = 0.0;
        {
            auto & freq = kEnglishLetterWithSpacesFreq;
            for (int i = 0; i <= 27; ++i) {
                float curf = 0.01*freq[i] - ((float)(letCount[i]))/((float)(nlet));
                letFreqCost += curf*curf;
            }
        }

        letFreqCost /= 28.0;
        letFreqCost = sqrt(letFreqCost);

        int i1 = 0;
        int k = len;
        TCode curc = 0;
        TCode mask = (1 << 5*(len-1)) - 1;

        while (k > 0) {
            if (i1 >= n) return -1e100;
            auto c = plain[i1++];
            curc <<= 5;
            curc += c;
            --k;
        }

        if (memo[i1 - 1] > 0.5) {
            memo[i1 - 1] = prob.find(curc) == prob.end() ? freqMap.pmin : prob.at(curc);
        }
        res += memo[i1 - 1];

        while (true) {
            curc &= mask;

            auto c = plain[i1++];
            curc <<= 5;
            curc += c;

            if (memo[i1 - 1] > 0.5) {
                memo[i1 - 1] = prob.find(curc) == prob.end() ? freqMap.pmin : prob.at(curc);
            }
            res += memo[i1 - 1];

            if (i1 >= n) break;
        }

        return res/n - params.wEnglishFreq*letFreqCost;
    }